

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saxman.h
# Opt level: O0

bool ClownLZSS::Internal::Saxman::Compress<std::ofstream>
               (uchar *data,size_t data_size,
               CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output)

{
  long lVar1;
  undefined8 uVar2;
  bool bVar3;
  type pCVar4;
  size_t length;
  size_t offset;
  ClownLZSS_Match *match;
  DescriptorFieldWriter<decltype(output)> descriptor_bits;
  size_t local_38;
  size_t total_matches;
  Matches matches;
  CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *output_local;
  size_t data_size_local;
  uchar *data_local;
  
  matches._M_t.super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
  super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
  super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl =
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)
       (__uniq_ptr_data<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter,_true,_true>)output;
  std::unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter>::
  unique_ptr<ClownLZSS::Internal::MatchDeleter,void>
            ((unique_ptr<ClownLZSS_Match[],ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  bVar3 = FindOptimalMatches(-1,0x12,0x1000,FindExtraMatches,9,GetMatchCost,data,1,data_size,
                             (Matches *)&total_matches,&local_38,(void *)0x0);
  if (bVar3) {
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)&match,
               (CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_> *)
               matches._M_t.
               super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
               super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
               super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl);
    offset = (size_t)std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::
                     operator[]((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)
                                &total_matches,0);
    while( true ) {
      pCVar4 = std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::operator[]
                         ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)
                          &total_matches,local_38);
      if ((type)offset == pCVar4) break;
      if (*(long *)offset == *(long *)(offset + 8) + 1) {
        BitField::
        WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                *)&match,true);
        OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                data[*(long *)(offset + 8)]);
      }
      else {
        lVar1 = *(long *)offset;
        uVar2 = *(undefined8 *)(offset + 0x10);
        BitField::
        WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
        ::Push((WriterBase<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&,_ClownLZSS::Internal::BitField::DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>_>
                *)&match,false);
        length._0_1_ = (uchar)(lVar1 + -0x12);
        OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,(uchar)length);
        length._0_4_ = (uint)(lVar1 + -0x12);
        OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
        ::Write((OutputCommonBase<ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 *)matches._M_t.
                   super___uniq_ptr_impl<ClownLZSS_Match,_ClownLZSS::Internal::MatchDeleter>._M_t.
                   super__Tuple_impl<0UL,_ClownLZSS_Match_*,_ClownLZSS::Internal::MatchDeleter>.
                   super__Head_base<0UL,_ClownLZSS_Match_*,_false>._M_head_impl,
                (byte)(((uint)length & 0xf00) >> 4) | (char)uVar2 - 3U);
      }
      offset = offset + 0x18;
    }
    data_local._7_1_ = true;
    descriptor_bits.descriptor_position._M_state.__count = 1;
    BitField::
    DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
    ::~DescriptorFieldWriter
              ((DescriptorFieldWriter<1U,_(ClownLZSS::Internal::BitField::WriteWhen)0,_(ClownLZSS::Internal::BitField::PushWhere)1,_(ClownLZSS::Internal::Endian)1,_ClownLZSS::CompressorOutput<std::basic_ofstream<char,_std::char_traits<char>_>_>_&>
                *)&match);
  }
  else {
    data_local._7_1_ = false;
    descriptor_bits.descriptor_position._M_state.__count = 1;
  }
  std::unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter>::~unique_ptr
            ((unique_ptr<ClownLZSS_Match[],_ClownLZSS::Internal::MatchDeleter> *)&total_matches);
  return data_local._7_1_;
}

Assistant:

inline bool Compress(const unsigned char* const data, const std::size_t data_size, CompressorOutput<T> &output)
			{
				// Produce a series of LZSS compression matches.
				ClownLZSS::Matches matches;
				std::size_t total_matches;
				if (!ClownLZSS::FindOptimalMatches(-1, 0x12, 0x1000, FindExtraMatches, 1 + 8, GetMatchCost, data, 1, data_size, &matches, &total_matches, nullptr))
					return false;

				DescriptorFieldWriter<decltype(output)> descriptor_bits(output);

				// Produce Saxman-formatted data.
				for (ClownLZSS_Match *match = &matches[0]; match != &matches[total_matches]; ++match)
				{
					if (CLOWNLZSS_MATCH_IS_LITERAL(match))
					{
						descriptor_bits.Push(1);
						output.Write(data[match->destination]);
					}
					else
					{
						const std::size_t offset = match->source - 0x12;
						const std::size_t length = match->length;

						descriptor_bits.Push(0);
						output.Write(offset & 0xFF);
						output.Write(((offset & 0xF00) >> 4) | (length - 3));
					}
				}

				return true;
			}